

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O2

void run_tests(void)

{
  uint __line;
  char cVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  void *__ptr;
  long lVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  char *__assertion;
  byte bVar8;
  size_t footer_len;
  uint8_t message_1 [5];
  void *local_90;
  uint8_t message [5];
  uint8_t key [32];
  
  bVar8 = 0;
  nonce_override(nonce);
  cVar1 = paseto_v2_local_load_key_base64(key,"gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw");
  if (cVar1 == '\0') {
    __assertion = 
    "paseto_v2_local_load_key_base64(key, \"gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw\") == true";
    pcVar3 = "void test_encode(void)";
    __line = 0xf;
  }
  else {
    builtin_memcpy(message,"test",5);
    pcVar3 = (char *)paseto_v2_local_encrypt(message,4,key,0,0);
    if (pcVar3 == (char *)0x0) {
      perror("paseto_v2_local_encrypt failed");
      __assertion = "enc != NULL";
      pcVar3 = "void test_encode(void)";
      __line = 0x13;
    }
    else {
      printf("enc: %s\n",pcVar3);
      iVar2 = strcmp("v2.local.AAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAbiP5Pgo9TuVWWC37ZRTtiYgJS9A",pcVar3);
      if (iVar2 == 0) {
        free(pcVar3);
        cVar1 = paseto_v2_local_load_key_base64
                          (message,"gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw");
        if (cVar1 == '\0') {
          __assertion = 
          "paseto_v2_local_load_key_base64(key, \"gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw\") == true"
          ;
          pcVar3 = "void test_decode(void)";
          __line = 0x1b;
        }
        else {
          puVar6 = (uint8_t *)"v2.local.O8cYeF1ljNyMEFqSD0akbinLPPhDXkG0kfdwHmYhwxwxbwdeFmaH_7LwrSw"
          ;
          puVar7 = key;
          for (lVar5 = 0x45; lVar5 != 0; lVar5 = lVar5 + -1) {
            *puVar7 = *puVar6;
            puVar6 = puVar6 + (ulong)bVar8 * -2 + 1;
            puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
          }
          footer_len = 0;
          piVar4 = (int *)paseto_v2_local_decrypt(key,&footer_len,message,0,0);
          if (piVar4 == (int *)0x0) {
            perror("paseto_v2_local_decrypt failed");
            __assertion = "message != NULL";
            pcVar3 = "void test_decode(void)";
            __line = 0x20;
          }
          else {
            printf("dec: %s\n",piVar4);
            if (footer_len == 4) {
              if (*piVar4 == 0x74736574) {
                free(piVar4);
                cVar1 = paseto_v2_local_load_key_base64
                                  (key,"This_is_the_key_base64url_encoded_unpadded8");
                if (cVar1 == '\0') {
                  __assertion = 
                  "paseto_v2_local_load_key_base64(key, \"This_is_the_key_base64url_encoded_unpadded8\") == true"
                  ;
                  pcVar3 = "void test_encode_decode_footer(void)";
                  __line = 0x29;
                }
                else {
                  builtin_memcpy(message_1,"test",5);
                  __ptr = (void *)paseto_v2_local_encrypt(message_1,4,key,"foot",5);
                  if (__ptr == (void *)0x0) {
                    perror("paseto_v2_local_encrypt failed");
                    __assertion = "enc != NULL";
                    pcVar3 = "void test_encode_decode_footer(void)";
                    __line = 0x2e;
                  }
                  else {
                    printf("enc: %s\n",__ptr);
                    message[0] = '\0';
                    message[1] = '\0';
                    message[2] = '\0';
                    message[3] = '\0';
                    message[4] = '\0';
                    footer_len = 0;
                    piVar4 = (int *)paseto_v2_local_decrypt(__ptr,message,key,&local_90);
                    if (piVar4 == (int *)0x0) {
                      perror("paseto_v2_local_decrypt failed");
                      free(__ptr);
                      __assertion = "message_dec != NULL";
                      pcVar3 = "void test_encode_decode_footer(void)";
                      __line = 0x37;
                    }
                    else {
                      free(__ptr);
                      printf("dec: %s footer: %s\n",piVar4,local_90);
                      if (CONCAT14(message[4],message._0_4_) == 4) {
                        if (footer_len == 5) {
                          if (message_1._0_4_ == *piVar4) {
                            iVar2 = bcmp("foot",local_90,5);
                            if (iVar2 == 0) {
                              free(piVar4);
                              cVar1 = paseto_v2_local_load_key_base64
                                                (key,"gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw");
                              if (cVar1 == '\0') {
                                __assertion = 
                                "paseto_v2_local_load_key_base64(key, \"gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw\") == true"
                                ;
                                pcVar3 = "void test_decode_invalid_header(void)";
                                __line = 0x42;
                              }
                              else {
                                footer_len = CONCAT26(footer_len._6_2_,0x2e00000000);
                                footer_len = CONCAT44(footer_len._4_4_,0x782e3276);
                                message[0] = '\0';
                                message[1] = '\0';
                                message[2] = '\0';
                                message[3] = '\0';
                                message[4] = '\0';
                                lVar5 = paseto_v2_local_decrypt(&footer_len,message,key,0,0);
                                piVar4 = __errno_location();
                                if (*piVar4 == 0x16) {
                                  if (lVar5 == 0) {
                                    cVar1 = paseto_v2_local_load_key_base64
                                                      (key,
                                                  "gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw");
                                    if (cVar1 == '\0') {
                                      __assertion = 
                                      "paseto_v2_local_load_key_base64(key, \"gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw\") == true"
                                      ;
                                      pcVar3 = "void test_decode_invalid_message_empty(void)";
                                      __line = 0x4c;
                                    }
                                    else {
                                      builtin_memcpy(message,"v2.lo",5);
                                      footer_len = 0;
                                      lVar5 = paseto_v2_local_decrypt(message,&footer_len,key,0,0);
                                      if (*piVar4 == 0x16) {
                                        if (lVar5 == 0) {
                                          cVar1 = paseto_v2_local_load_key_base64
                                                            (key,
                                                  "gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw");
                                          if (cVar1 == '\0') {
                                            __assertion = 
                                            "paseto_v2_local_load_key_base64(key, \"gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw\") == true"
                                            ;
                                            pcVar3 = "void test_decode_invalid_message_short(void)";
                                            __line = 0x56;
                                          }
                                          else {
                                            builtin_memcpy(message,"v2.lo",5);
                                            footer_len = 0;
                                            lVar5 = paseto_v2_local_decrypt
                                                              (message,&footer_len,key,0,0);
                                            if (*piVar4 == 0x16) {
                                              if (lVar5 == 0) {
                                                cVar1 = paseto_v2_local_load_key_base64
                                                                  (message,
                                                  "gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw");
                                                if (cVar1 == '\0') {
                                                  __assertion = 
                                                  "paseto_v2_local_load_key_base64(key, \"gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw\") == true"
                                                  ;
                                                  pcVar3 = 
                                                  "void test_decode_invalid_message_long(void)";
                                                  __line = 0x60;
                                                }
                                                else {
                                                  puVar6 = (uint8_t *)
                                                                                                                      
                                                  "v2.local.AAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAA"
                                                  ;
                                                  puVar7 = key;
                                                  for (lVar5 = 0x52; lVar5 != 0; lVar5 = lVar5 + -1)
                                                  {
                                                    *puVar7 = *puVar6;
                                                    puVar6 = puVar6 + (ulong)bVar8 * -2 + 1;
                                                    puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
                                                  }
                                                  footer_len = 0;
                                                  lVar5 = paseto_v2_local_decrypt
                                                                    (key,&footer_len,message,0,0);
                                                  if (*piVar4 == 0x16) {
                                                    if (lVar5 == 0) {
                                                      return;
                                                    }
                                                    __assertion = "message == NULL";
                                                    pcVar3 = 
                                                  "void test_decode_invalid_message_long(void)";
                                                  __line = 0x65;
                                                  }
                                                  else {
                                                    __assertion = "errno == EINVAL";
                                                    pcVar3 = 
                                                  "void test_decode_invalid_message_long(void)";
                                                  __line = 100;
                                                  }
                                                }
                                              }
                                              else {
                                                __assertion = "message == NULL";
                                                pcVar3 = 
                                                "void test_decode_invalid_message_short(void)";
                                                __line = 0x5b;
                                              }
                                            }
                                            else {
                                              __assertion = "errno == EINVAL";
                                              pcVar3 = 
                                              "void test_decode_invalid_message_short(void)";
                                              __line = 0x5a;
                                            }
                                          }
                                        }
                                        else {
                                          __assertion = "message == NULL";
                                          pcVar3 = "void test_decode_invalid_message_empty(void)";
                                          __line = 0x51;
                                        }
                                      }
                                      else {
                                        __assertion = "errno == EINVAL";
                                        pcVar3 = "void test_decode_invalid_message_empty(void)";
                                        __line = 0x50;
                                      }
                                    }
                                  }
                                  else {
                                    __assertion = "message == NULL";
                                    pcVar3 = "void test_decode_invalid_header(void)";
                                    __line = 0x47;
                                  }
                                }
                                else {
                                  __assertion = "errno == EINVAL";
                                  pcVar3 = "void test_decode_invalid_header(void)";
                                  __line = 0x46;
                                }
                              }
                            }
                            else {
                              __assertion = "memcmp(\"foot\", footer, 5) == 0";
                              pcVar3 = "void test_encode_decode_footer(void)";
                              __line = 0x3c;
                            }
                          }
                          else {
                            __assertion = "memcmp(message, message_dec, message_len) == 0";
                            pcVar3 = "void test_encode_decode_footer(void)";
                            __line = 0x3b;
                          }
                        }
                        else {
                          __assertion = "footer_len == 5";
                          pcVar3 = "void test_encode_decode_footer(void)";
                          __line = 0x3a;
                        }
                      }
                      else {
                        __assertion = "message_len_dec == message_len";
                        pcVar3 = "void test_encode_decode_footer(void)";
                        __line = 0x39;
                      }
                    }
                  }
                }
              }
              else {
                __assertion = "memcmp(\"test\", message, 4) == 0";
                pcVar3 = "void test_decode(void)";
                __line = 0x23;
              }
            }
            else {
              __assertion = "message_len == 4";
              pcVar3 = "void test_decode(void)";
              __line = 0x22;
            }
          }
        }
      }
      else {
        __assertion = 
        "strcmp(\"v2.local.AAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAbiP5Pgo9TuVWWC37ZRTtiYgJS9A\", enc) == 0"
        ;
        pcVar3 = "void test_encode(void)";
        __line = 0x15;
      }
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/test.c"
                ,__line,pcVar3);
}

Assistant:

static void test_encode(void) {
    nonce_override(nonce);
    uint8_t key[paseto_v2_LOCAL_KEYBYTES];
    assert(paseto_v2_local_load_key_base64(key, "gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw") == true);
    const uint8_t message[] = "test";
    char *enc = paseto_v2_local_encrypt(message, 4, key, NULL, 0);
    if (!enc) perror("paseto_v2_local_encrypt failed");
    assert(enc != NULL);
    printf("enc: %s\n", enc);
    assert(strcmp("v2.local.AAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAbiP5Pgo9TuVWWC37ZRTtiYgJS9A", enc) == 0);
    free(enc);
}